

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::Synth(Synth *this,ReportHandler *useReportHandler)

{
  MemParams *pMVar1;
  Extensions *pEVar2;
  
  pMVar1 = (MemParams *)operator_new(0x10dab);
  this->mt32ram = pMVar1;
  pMVar1 = (MemParams *)operator_new(0x10dab);
  this->mt32default = pMVar1;
  pEVar2 = (Extensions *)operator_new(0xd0);
  (pEVar2->defaultReportHandler).super_ReportHandler._vptr_ReportHandler =
       (_func_int **)&PTR__ReportHandler_00134d50;
  this->extensions = pEVar2;
  this->opened = false;
  this->reverbOverridden = false;
  if (useReportHandler == (ReportHandler *)0x0) {
    useReportHandler = &(pEVar2->defaultReportHandler).super_ReportHandler;
  }
  this->partialCount = 0x20;
  this->controlROMFeatures = (ControlROMFeatureSet *)0x0;
  this->controlROMMap = (ControlROMMap *)0x0;
  this->reportHandler = useReportHandler;
  pEVar2->reportHandler2 = &pEVar2->defaultReportHandler;
  pEVar2->preallocatedReverbMemory = false;
  this->reverbModels[0] = (BReverbModel *)0x0;
  this->reverbModels[1] = (BReverbModel *)0x0;
  this->reverbModels[2] = (BReverbModel *)0x0;
  this->reverbModels[3] = (BReverbModel *)0x0;
  this->reverbModel = (BReverbModel *)0x0;
  this->analog = (Analog *)0x0;
  this->renderer = (Renderer *)0x0;
  this->midiDelayMode = MIDIDelayMode_DELAY_SHORT_MESSAGES_ONLY;
  this->dacInputMode = DACInputMode_NICE;
  this->outputGain = 1.0;
  setReverbOutputGain(this,1.0);
  this->reversedStereoEnabled = false;
  pEVar2 = this->extensions;
  pEVar2->niceAmpRamp = true;
  pEVar2->nicePanning = false;
  pEVar2->nicePartialMixing = false;
  pEVar2->selectedRendererType = RendererType_BIT16S;
  this->partialManager = (PartialManager *)0x0;
  this->pcmROMData = (Bit16s *)0x0;
  this->soundGroupNames = (char (*) [9])0x0;
  this->midiQueue = (MidiEventQueue *)0x0;
  this->patchTempMemoryRegion = (PatchTempMemoryRegion *)0x0;
  this->rhythmTempMemoryRegion = (RhythmTempMemoryRegion *)0x0;
  this->timbreTempMemoryRegion = (TimbreTempMemoryRegion *)0x0;
  this->patchesMemoryRegion = (PatchesMemoryRegion *)0x0;
  this->timbresMemoryRegion = (TimbresMemoryRegion *)0x0;
  this->systemMemoryRegion = (SystemMemoryRegion *)0x0;
  this->displayMemoryRegion = (DisplayMemoryRegion *)0x0;
  this->resetMemoryRegion = (ResetMemoryRegion *)0x0;
  this->paddedTimbreMaxTable = (Bit8u *)0x0;
  this->pcmWaves = (PCMWaveEntry *)0x0;
  pEVar2->midiEventQueueSize = 0x400;
  pEVar2->midiEventQueueSysexStorageBufferSize = 0;
  this->lastReceivedMIDIEventTimestamp = 0;
  this->parts[0] = (Part *)0x0;
  this->parts[1] = (Part *)0x0;
  this->parts[2] = (Part *)0x0;
  this->parts[3] = (Part *)0x0;
  this->parts[4] = (Part *)0x0;
  this->parts[5] = (Part *)0x0;
  this->parts[6] = (Part *)0x0;
  this->parts[7] = (Part *)0x0;
  this->parts[8] = (Part *)0x0;
  this->renderedSampleCount = 0;
  pEVar2->display = (Display *)0x0;
  pEVar2->oldMT32DisplayFeatures = false;
  return;
}

Assistant:

Synth::Synth(ReportHandler *useReportHandler) :
	mt32ram(*new MemParams),
	mt32default(*new MemParams),
	extensions(*new Extensions)
{
	opened = false;
	reverbOverridden = false;
	partialCount = DEFAULT_MAX_PARTIALS;
	controlROMMap = NULL;
	controlROMFeatures = NULL;

	reportHandler = useReportHandler != NULL ? useReportHandler : &extensions.defaultReportHandler;
	extensions.reportHandler2 = &extensions.defaultReportHandler;

	extensions.preallocatedReverbMemory = false;
	for (int i = REVERB_MODE_ROOM; i <= REVERB_MODE_TAP_DELAY; i++) {
		reverbModels[i] = NULL;
	}
	reverbModel = NULL;
	analog = NULL;
	renderer = NULL;
	setDACInputMode(DACInputMode_NICE);
	setMIDIDelayMode(MIDIDelayMode_DELAY_SHORT_MESSAGES_ONLY);
	setOutputGain(1.0f);
	setReverbOutputGain(1.0f);
	setReversedStereoEnabled(false);
	setNiceAmpRampEnabled(true);
	setNicePanningEnabled(false);
	setNicePartialMixingEnabled(false);
	selectRendererType(RendererType_BIT16S);

	patchTempMemoryRegion = NULL;
	rhythmTempMemoryRegion = NULL;
	timbreTempMemoryRegion = NULL;
	patchesMemoryRegion = NULL;
	timbresMemoryRegion = NULL;
	systemMemoryRegion = NULL;
	displayMemoryRegion = NULL;
	resetMemoryRegion = NULL;
	paddedTimbreMaxTable = NULL;

	partialManager = NULL;
	pcmWaves = NULL;
	pcmROMData = NULL;
	soundGroupNames = NULL;
	midiQueue = NULL;
	extensions.midiEventQueueSize = DEFAULT_MIDI_EVENT_QUEUE_SIZE;
	extensions.midiEventQueueSysexStorageBufferSize = 0;
	lastReceivedMIDIEventTimestamp = 0;
	memset(parts, 0, sizeof(parts));
	renderedSampleCount = 0;
	extensions.display = NULL;
	extensions.oldMT32DisplayFeatures = false;
}